

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PointSetNode::PointSetNode
          (PointSetNode *this,RTCGeometryType type,Ref<embree::SceneGraph::MaterialNode> *material,
          BBox1f time_range,size_t numTimeSteps)

{
  ulong in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  size_t i;
  size_t i_2;
  size_t i_1;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Node *in_stack_fffffffffffffed0;
  undefined1 local_e0 [8];
  ulong local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  ulong local_c0;
  ulong local_a8;
  undefined4 local_94;
  undefined8 local_88;
  long *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  ulong local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_a8 = in_RCX;
  local_94 = in_ESI;
  local_88 = in_XMM0_Qa;
  Node::Node(in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
  *in_RDI = &PTR__PointSetNode_0061c5b8;
  in_RDI[0xd] = local_88;
  *(undefined4 *)(in_RDI + 0xe) = local_94;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)0x36ac62);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x36ac78);
  local_78 = in_RDI + 0x15;
  *local_78 = *in_RDX;
  if (*local_78 != 0) {
    (**(code **)(*(long *)*local_78 + 0x10))();
  }
  for (local_c0 = 0; local_c0 < local_a8; local_c0 = local_c0 + 1) {
    local_68 = local_e0;
    local_d8 = 0;
    local_d0 = 0;
    local_c8 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 *)in_stack_fffffffffffffed0,
                (value_type *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    local_60 = local_e0;
    for (local_40 = 0; local_40 < local_d8; local_40 = local_40 + 1) {
    }
    local_30 = local_d0;
    local_28 = local_c8;
    local_38 = local_60;
    local_20 = local_60;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  return;
}

Assistant:

PointSetNode (RTCGeometryType type, Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0)
        : Node(true), time_range(time_range), type(type), material(material)
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
      }